

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void google::protobuf::FileOptions::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  ulong uVar2;
  _func_int **pp_Var3;
  MessageLite *from_msg_00;
  MessageLite *to_msg_00;
  void *pvVar4;
  Nonnull<const_char_*> pcVar5;
  Arena *pAVar6;
  Arena *arena;
  
  arena = (Arena *)(to_msg->_internal_metadata_).ptr_;
  if (((ulong)arena & 1) != 0) {
    arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
  }
  if (from_msg == to_msg) {
    pcVar5 = absl::lts_20250127::log_internal::MakeCheckOpString<void_const*,void_const*>
                       (from_msg,to_msg,"&from != _this");
  }
  else {
    pcVar5 = (Nonnull<const_char_*>)0x0;
  }
  if (pcVar5 == (Nonnull<const_char_*>)0x0) {
    if ((int)from_msg[3]._internal_metadata_.ptr_ != 0) {
      internal::RepeatedPtrFieldBase::MergeFromConcreteMessage
                ((RepeatedPtrFieldBase *)(to_msg + 3),(RepeatedPtrFieldBase *)(from_msg + 3),
                 Arena::CopyConstruct<google::protobuf::UninterpretedOption>);
    }
    uVar1 = (uint)from_msg[2]._internal_metadata_.ptr_;
    if ((char)uVar1 != '\0') {
      if ((uVar1 & 1) != 0) {
        uVar2 = from_msg[4]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 1;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[4]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar6);
      }
      if ((uVar1 & 2) != 0) {
        pp_Var3 = from_msg[5]._vptr_MessageLite;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 2;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 5),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar6);
      }
      if ((uVar1 & 4) != 0) {
        uVar2 = from_msg[5]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 4;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[5]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar6);
      }
      if ((uVar1 & 8) != 0) {
        pp_Var3 = from_msg[6]._vptr_MessageLite;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | 8;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 6),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar6);
      }
      if ((uVar1 & 0x10) != 0) {
        uVar2 = from_msg[6]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x10;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[6]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar6);
      }
      if ((uVar1 & 0x20) != 0) {
        pp_Var3 = from_msg[7]._vptr_MessageLite;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x20;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 7),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar6);
      }
      if ((uVar1 & 0x40) != 0) {
        uVar2 = from_msg[7]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x40;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[7]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar6);
      }
      if ((char)uVar1 < '\0') {
        pp_Var3 = from_msg[8]._vptr_MessageLite;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x80;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 8),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar6);
      }
    }
    if ((uVar1 & 0xff00) != 0) {
      if ((uVar1 >> 8 & 1) != 0) {
        uVar2 = from_msg[8]._internal_metadata_.ptr_;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x100;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)&to_msg[8]._internal_metadata_,
                   (string *)(uVar2 & 0xfffffffffffffffc),pAVar6);
      }
      if ((uVar1 >> 9 & 1) != 0) {
        pp_Var3 = from_msg[9]._vptr_MessageLite;
        *(uint *)&to_msg[2]._internal_metadata_.ptr_ =
             (uint)to_msg[2]._internal_metadata_.ptr_ | 0x200;
        pAVar6 = (Arena *)(to_msg->_internal_metadata_).ptr_;
        if (((ulong)pAVar6 & 1) != 0) {
          pAVar6 = *(Arena **)((ulong)pAVar6 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>
                  ((ArenaStringPtr *)(to_msg + 9),(string *)((ulong)pp_Var3 & 0xfffffffffffffffc),
                   pAVar6);
      }
      if ((uVar1 >> 10 & 1) != 0) {
        from_msg_00 = (MessageLite *)from_msg[9]._internal_metadata_.ptr_;
        if (from_msg_00 == (MessageLite *)0x0) {
          MergeImpl((FileOptions *)&stack0xffffffffffffffd0);
          goto LAB_00211ddd;
        }
        to_msg_00 = (MessageLite *)to_msg[9]._internal_metadata_.ptr_;
        if (to_msg_00 == (MessageLite *)0x0) {
          pvVar4 = Arena::CopyConstruct<google::protobuf::FeatureSet>(arena,from_msg_00);
          to_msg[9]._internal_metadata_.ptr_ = (intptr_t)pvVar4;
        }
        else {
          FeatureSet::MergeImpl(to_msg_00,from_msg_00);
        }
      }
      if ((uVar1 >> 0xb & 1) != 0) {
        *(undefined1 *)&to_msg[10]._vptr_MessageLite =
             *(undefined1 *)&from_msg[10]._vptr_MessageLite;
      }
      if ((uVar1 >> 0xc & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 1) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 1);
      }
      if ((uVar1 >> 0xd & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 2) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 2);
      }
      if ((uVar1 >> 0xe & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 3) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 3);
      }
      if ((short)uVar1 < 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 4) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 4);
      }
    }
    if ((uVar1 & 0xf0000) != 0) {
      if ((uVar1 >> 0x10 & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 5) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 5);
      }
      if ((uVar1 >> 0x11 & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._vptr_MessageLite + 6) =
             *(undefined1 *)((long)&from_msg[10]._vptr_MessageLite + 6);
      }
      if ((uVar1 >> 0x12 & 1) != 0) {
        *(int *)&to_msg[10]._internal_metadata_.ptr_ = (int)from_msg[10]._internal_metadata_.ptr_;
      }
      if ((uVar1 >> 0x13 & 1) != 0) {
        *(undefined1 *)((long)&to_msg[10]._internal_metadata_.ptr_ + 4) =
             *(undefined1 *)((long)&from_msg[10]._internal_metadata_.ptr_ + 4);
      }
    }
    *(uint *)&to_msg[2]._internal_metadata_.ptr_ = (uint)to_msg[2]._internal_metadata_.ptr_ | uVar1;
    internal::ExtensionSet::MergeFrom
              ((ExtensionSet *)(to_msg + 1),(MessageLite *)_FileOptions_default_instance_,
               (ExtensionSet *)(from_msg + 1));
    uVar2 = (from_msg->_internal_metadata_).ptr_;
    if ((uVar2 & 1) == 0) {
      return;
    }
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (&to_msg->_internal_metadata_,(UnknownFieldSet *)((uVar2 & 0xfffffffffffffffe) + 8));
    return;
  }
LAB_00211ddd:
  MergeImpl();
}

Assistant:

void FileOptions::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<FileOptions*>(&to_msg);
  auto& from = static_cast<const FileOptions&>(from_msg);
  ::google::protobuf::Arena* arena = _this->GetArena();
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.FileOptions)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_uninterpreted_option()->MergeFrom(
      from._internal_uninterpreted_option());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      _this->_internal_set_java_package(from._internal_java_package());
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      _this->_internal_set_java_outer_classname(from._internal_java_outer_classname());
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      _this->_internal_set_go_package(from._internal_go_package());
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      _this->_internal_set_objc_class_prefix(from._internal_objc_class_prefix());
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      _this->_internal_set_csharp_namespace(from._internal_csharp_namespace());
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      _this->_internal_set_swift_prefix(from._internal_swift_prefix());
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      _this->_internal_set_php_class_prefix(from._internal_php_class_prefix());
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      _this->_internal_set_php_namespace(from._internal_php_namespace());
    }
  }
  if ((cached_has_bits & 0x0000ff00u) != 0) {
    if ((cached_has_bits & 0x00000100u) != 0) {
      _this->_internal_set_php_metadata_namespace(from._internal_php_metadata_namespace());
    }
    if ((cached_has_bits & 0x00000200u) != 0) {
      _this->_internal_set_ruby_package(from._internal_ruby_package());
    }
    if ((cached_has_bits & 0x00000400u) != 0) {
      ABSL_DCHECK(from._impl_.features_ != nullptr);
      if (_this->_impl_.features_ == nullptr) {
        _this->_impl_.features_ = ::google::protobuf::Message::CopyConstruct(arena, *from._impl_.features_);
      } else {
        _this->_impl_.features_->MergeFrom(*from._impl_.features_);
      }
    }
    if ((cached_has_bits & 0x00000800u) != 0) {
      _this->_impl_.java_multiple_files_ = from._impl_.java_multiple_files_;
    }
    if ((cached_has_bits & 0x00001000u) != 0) {
      _this->_impl_.cc_generic_services_ = from._impl_.cc_generic_services_;
    }
    if ((cached_has_bits & 0x00002000u) != 0) {
      _this->_impl_.java_generic_services_ = from._impl_.java_generic_services_;
    }
    if ((cached_has_bits & 0x00004000u) != 0) {
      _this->_impl_.py_generic_services_ = from._impl_.py_generic_services_;
    }
    if ((cached_has_bits & 0x00008000u) != 0) {
      _this->_impl_.java_generate_equals_and_hash_ = from._impl_.java_generate_equals_and_hash_;
    }
  }
  if ((cached_has_bits & 0x000f0000u) != 0) {
    if ((cached_has_bits & 0x00010000u) != 0) {
      _this->_impl_.deprecated_ = from._impl_.deprecated_;
    }
    if ((cached_has_bits & 0x00020000u) != 0) {
      _this->_impl_.java_string_check_utf8_ = from._impl_.java_string_check_utf8_;
    }
    if ((cached_has_bits & 0x00040000u) != 0) {
      _this->_impl_.optimize_for_ = from._impl_.optimize_for_;
    }
    if ((cached_has_bits & 0x00080000u) != 0) {
      _this->_impl_.cc_enable_arenas_ = from._impl_.cc_enable_arenas_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_impl_._extensions_.MergeFrom(&default_instance(), from._impl_._extensions_);
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}